

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

void __thiscall
QList<DomStringPropertySpecification_*>::clear(QList<DomStringPropertySpecification_*> *this)

{
  Data *pDVar1;
  qsizetype capacity;
  long in_FS_OFFSET;
  pair<QTypedArrayData<DomStringPropertySpecification_*>_*,_DomStringPropertySpecification_**> pVar2
  ;
  QArrayDataPointer<DomStringPropertySpecification_*> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->d).size != 0) {
    pDVar1 = (this->d).d;
    if (pDVar1 == (Data *)0x0) {
      capacity = 0;
    }
    else {
      if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2) {
        (this->d).size = 0;
        goto LAB_0016472b;
      }
      capacity = (pDVar1->super_QArrayData).alloc;
    }
    local_28.size = -0x5555555555555556;
    local_28.ptr = (DomStringPropertySpecification **)0xaaaaaaaaaaaaaaaa;
    pVar2 = QTypedArrayData<DomStringPropertySpecification_*>::allocate(capacity,KeepSize);
    local_28.d = (this->d).d;
    local_28.ptr = (this->d).ptr;
    (this->d).d = pVar2.first;
    (this->d).ptr = pVar2.second;
    local_28.size = (this->d).size;
    (this->d).size = 0;
    QArrayDataPointer<DomStringPropertySpecification_*>::~QArrayDataPointer(&local_28);
  }
LAB_0016472b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void clear() {
        if (!size())
            return;
        if (d->needsDetach()) {
            // must allocate memory
            DataPointer detached(d.allocatedCapacity());
            d.swap(detached);
        } else {
            d->truncate(0);
        }
    }